

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

base_learner * warm_cb_setup(options_i *options,vw *all)

{
  float fVar1;
  float fVar2;
  vw *pvVar3;
  long *plVar4;
  byte bVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  pointer pwVar8;
  float *pfVar9;
  ostream *this;
  vw *in_RSI;
  int iVar10;
  long *in_RDI;
  multi_learner *base;
  learner<warm_cb,_example> *l;
  stringstream ss;
  stringstream __msg;
  option_group_definition new_options;
  bool use_cs;
  free_ptr<warm_cb> data;
  uint32_t num_actions;
  undefined4 in_stack_ffffffffffffe898;
  float in_stack_ffffffffffffe89c;
  vw *in_stack_ffffffffffffe8a0;
  string *in_stack_ffffffffffffe8a8;
  _func_void_warm_cb_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
  *predict;
  typed_option<float> *in_stack_ffffffffffffe8b0;
  parser *in_stack_ffffffffffffe8b8;
  learner<warm_cb,_example> *in_stack_ffffffffffffe8c0;
  char *in_stack_ffffffffffffe8c8;
  prediction_type_t pred_type;
  warm_cb *in_stack_ffffffffffffe8d0;
  typed_option<float> *ptVar11;
  size_t in_stack_ffffffffffffe8d8;
  void *in_stack_ffffffffffffe8e0;
  typed_option<float> *in_stack_ffffffffffffe8e8;
  undefined6 in_stack_ffffffffffffe8f0;
  undefined1 in_stack_ffffffffffffe8f6;
  undefined1 in_stack_ffffffffffffe8f7;
  byte local_161a;
  byte local_1601;
  allocator *l_00;
  allocator local_13c1;
  string local_13c0 [32];
  typed_option<float> *local_13a0;
  learner<warm_cb,_example> *local_1398;
  string local_1390 [39];
  allocator local_1369;
  string local_1368 [32];
  float local_1348;
  float local_1344;
  stringstream local_1340 [16];
  undefined1 local_1330 [383];
  allocator local_11b1;
  string local_11b0 [32];
  string local_1190 [39];
  allocator local_1169;
  string local_1168 [32];
  string local_1148 [39];
  allocator local_1121;
  string local_1120 [32];
  action_score *local_1100;
  action_score *paStack_10f8;
  action_score *local_10f0;
  size_t sStack_10e8;
  undefined4 local_10e0;
  allocator local_10d9;
  string local_10d8 [39];
  undefined1 local_10b1;
  stringstream local_1090 [16];
  ostream local_1080;
  byte local_f03;
  byte local_f02;
  allocator local_f01;
  string local_f00 [37];
  byte local_edb;
  byte local_eda;
  allocator local_ed9;
  string local_ed8 [39];
  allocator local_eb1;
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [199];
  allocator local_dc1;
  string local_dc0 [39];
  allocator local_d99;
  string local_d98 [199];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [199];
  allocator local_be1;
  string local_be0 [39];
  allocator local_bb9;
  string local_bb8 [199];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [199];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [199];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [199];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [199];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [199];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [32];
  typed_option<float> local_5f8;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [199];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [199];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [199];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [199];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  typed_option<unsigned_int> local_148;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [63];
  byte local_31;
  undefined1 local_30 [20];
  undefined4 local_1c;
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_1c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<warm_cb>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"Make Multiclass into Warm-starting Contextual Bandit",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"warm_cb",&local_169);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe8a8,(uint *)in_stack_ffffffffffffe8a0)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_148,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,"Convert multiclass on <k> classes into a contextual bandit problem",
             &local_191);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"warm_cb_cs",&local_259);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8a8,(bool *)in_stack_ffffffffffffe8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"consume cost-sensitive classification examples instead of multiclass",
             &local_281);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"loss0",&local_349);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3659c5);
  VW::config::make_option<float>(in_stack_ffffffffffffe8a8,(float *)in_stack_ffffffffffffe8a0);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8b0,(float)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"loss for correct label",&local_371);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"loss1",&local_439);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x365aae);
  VW::config::make_option<float>(in_stack_ffffffffffffe8a8,(float *)in_stack_ffffffffffffe8a0);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8b0,(float)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"loss for incorrect label",&local_461);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"warm_start",&local_529);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x365b9c);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe8a8,(uint *)in_stack_ffffffffffffe8a0)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8b0,
             (uint)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_550,"number of training examples for warm start phase",&local_551);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"epsilon",&local_619);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x365c84);
  VW::config::make_option<float>(in_stack_ffffffffffffe8a8,(float *)in_stack_ffffffffffffe8a0);
  VW::config::typed_option<float>::keep(&local_5f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"epsilon-greedy exploration",&local_641);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"interaction",&local_709);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x365d72);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe8a8,(uint *)in_stack_ffffffffffffe8a0)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8b0,
             (uint)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_730,"number of examples for the interactive contextual bandit learning phase",
             &local_731);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"warm_start_update",&local_7f9);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x365e5d);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8a8,(bool *)in_stack_ffffffffffffe8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"indicator of warm start updates",&local_821);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"interaction_update",&local_8e9);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x365f2f);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8a8,(bool *)in_stack_ffffffffffffe8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_910,"indicator of interaction updates",&local_911);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"corrupt_type_warm_start",&local_9d9);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x366001);
  VW::config::make_option<int>(in_stack_ffffffffffffe8a8,(int *)in_stack_ffffffffffffe8a0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_ffffffffffffe8b0,
             (int)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a00,
             "type of label corruption in the warm start phase (1: uniformly at random, 2: circular, 3: replacing with overwriting label)"
             ,&local_a01);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<int> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"corrupt_prob_warm_start",&local_ac9);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3660ef);
  VW::config::make_option<float>(in_stack_ffffffffffffe8a8,(float *)in_stack_ffffffffffffe8a0);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8b0,(float)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_af0,"probability of label corruption in the warm start phase",&local_af1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb8,"choices_lambda",&local_bb9);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3661db);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe8a8,(uint *)in_stack_ffffffffffffe8a0)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8b0,
             (uint)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_be0,
             "the number of candidate lambdas to aggregate (lambda is the importance weight parameter between the two sources)"
             ,&local_be1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe8e8);
  l_00 = &local_ca9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"lambda_scheme",l_00);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3662c6);
  VW::config::make_option<int>(in_stack_ffffffffffffe8a8,(int *)in_stack_ffffffffffffe8a0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_ffffffffffffe8b0,
             (int)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cd0,
             "The scheme for generating candidate lambda set (1: center lambda=0.5, 2: center lambda=0.5, min lambda=0, max lambda=1, 3: center lambda=epsilon/(1+epsilon), 4: center lambda=epsilon/(1+epsilon), min lambda=0, max lambda=1); the rest of candidate lambda values are generated using a doubling scheme"
             ,&local_cd1);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<int> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d98,"overwrite_label",&local_d99);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3663b4);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe8a8,(uint *)in_stack_ffffffffffffe8a0)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8b0,
             (uint)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_dc0,"the label used by type 3 corruptions (overwriting)",&local_dc1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe8e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"sim_bandit",&local_e89);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3664a2);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8a8,(bool *)in_stack_ffffffffffffe8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_eb0,"simulate contextual bandit updates on warm start examples",&local_eb1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8a0,
             (string *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe8f7,
                      CONCAT16(in_stack_ffffffffffffe8f6,in_stack_ffffffffffffe8f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe8e8);
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::__cxx11::string::~string(local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_d99);
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  std::__cxx11::string::~string(local_be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_be1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::__cxx11::string::~string(local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe8a0);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  (**(code **)*local_10)(local_10,local_70);
  plVar4 = local_10;
  local_eda = 0;
  local_edb = 0;
  local_f02 = 0;
  local_f03 = 0;
  local_1601 = 0;
  if ((local_31 & 1) != 0) {
    std::allocator<char>::allocator();
    local_eda = 1;
    std::__cxx11::string::string(local_ed8,"corrupt_type_warm_start",&local_ed9);
    local_edb = 1;
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_ed8);
    plVar4 = local_10;
    local_161a = 1;
    if ((bVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      local_f02 = 1;
      std::__cxx11::string::string(local_f00,"corrupt_prob_warm_start",&local_f01);
      local_f03 = 1;
      local_161a = (**(code **)(*plVar4 + 8))(plVar4,local_f00);
    }
    local_1601 = local_161a;
  }
  if ((local_f03 & 1) != 0) {
    std::__cxx11::string::~string(local_f00);
  }
  if ((local_f02 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f01);
  }
  if ((local_edb & 1) != 0) {
    std::__cxx11::string::~string(local_ed8);
  }
  if ((local_eda & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
  }
  plVar4 = local_10;
  if ((local_1601 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_1090);
    iVar10 = (int)((ulong)in_stack_ffffffffffffe8c0 >> 0x20);
    std::operator<<(&local_1080,
                    "label corruption on cost-sensitive examples not currently supported");
    local_10b1 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)in_stack_ffffffffffffe8d0,in_stack_ffffffffffffe8c8,iVar10,
               (string *)in_stack_ffffffffffffe8b8);
    local_10b1 = 0;
    __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10d8,"warm_cb",&local_10d9);
  bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_10d8);
  std::__cxx11::string::~string(local_10d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
  if (((bVar5 ^ 0xff) & 1) == 0) {
    uVar7 = uniform_hash(in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8,
                         (uint64_t)in_stack_ffffffffffffe8d0);
    pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                       ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x36791a);
    pwVar8->app_seed = uVar7;
    v_init<ACTION_SCORE::action_score>();
    pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                       ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x36794a);
    pvVar3 = local_18;
    (pwVar8->a_s).end_array = local_10f0;
    (pwVar8->a_s).erase_count = sStack_10e8;
    (pwVar8->a_s)._begin = local_1100;
    (pwVar8->a_s)._end = paStack_10f8;
    pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                       ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x36797f);
    bVar5 = local_31;
    pwVar8->all = pvVar3;
    pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                       ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3679a6);
    pwVar8->use_cs = (bool)(bVar5 & 1);
    std::unique_ptr<warm_cb,_void_(*)(void_*)>::get
              ((unique_ptr<warm_cb,_void_(*)(void_*)> *)in_stack_ffffffffffffe8a0);
    init_adf_data(in_stack_ffffffffffffe8d0,(size_t)in_stack_ffffffffffffe8c8);
    plVar4 = local_10;
    pred_type = (prediction_type_t)in_stack_ffffffffffffe8d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1120,"cb_min_cost",&local_1121);
    std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
              ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x367a26);
    std::__cxx11::to_string(in_stack_ffffffffffffe89c);
    (**(code **)(*plVar4 + 0x28))(plVar4,local_1120,local_1148);
    std::__cxx11::string::~string(local_1148);
    std::__cxx11::string::~string(local_1120);
    std::allocator<char>::~allocator((allocator<char> *)&local_1121);
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1168,"cb_max_cost",&local_1169);
    std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
              ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x367ad4);
    std::__cxx11::to_string(in_stack_ffffffffffffe89c);
    (**(code **)(*plVar4 + 0x28))(plVar4,local_1168,local_1190);
    std::__cxx11::string::~string(local_1190);
    std::__cxx11::string::~string(local_1168);
    std::allocator<char>::~allocator((allocator<char> *)&local_1169);
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11b0,"baseline",&local_11b1);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_11b0);
    std::__cxx11::string::~string(local_11b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11b1);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1340);
      iVar10 = (int)local_30;
      std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x367bed);
      std::abs(iVar10);
      iVar10 = (int)local_30;
      std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x367c21);
      std::abs(iVar10);
      pfVar9 = std::max<float>(&local_1344,&local_1348);
      fVar1 = *pfVar9;
      pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                         ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x367c91);
      fVar2 = pwVar8->loss1;
      pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                         ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x367cac);
      std::ostream::operator<<(local_1330,fVar1 / (fVar2 - pwVar8->loss0));
      plVar4 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1368,"lr_multiplier",&local_1369);
      std::__cxx11::stringstream::str();
      (**(code **)(*plVar4 + 0x28))(plVar4,local_1368,local_1390);
      std::__cxx11::string::~string(local_1390);
      std::__cxx11::string::~string(local_1368);
      std::allocator<char>::~allocator((allocator<char> *)&local_1369);
      std::__cxx11::stringstream::~stringstream(local_1340);
    }
    setup_base((options_i *)in_stack_ffffffffffffe8a8,in_stack_ffffffffffffe8a0);
    local_13a0 = (typed_option<float> *)
                 LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_13c0,"epsilon",&local_13c1);
    bVar5 = (**(code **)(*local_10 + 8))(local_10,local_13c0);
    bVar5 = bVar5 ^ 0xff;
    std::__cxx11::string::~string(local_13c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
    if ((bVar5 & 1) != 0) {
      this = std::operator<<((ostream *)&std::cerr,
                             "Warning: no epsilon (greedy parameter) specified; resetting to 0.05");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      pwVar8 = std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                         ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x36803b);
      pwVar8->epsilon = 0.05;
    }
    if ((local_31 & 1) == 0) {
      in_stack_ffffffffffffe8b8 = local_18->p;
      predict = (_func_void_warm_cb_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                 *)local_30;
      in_stack_ffffffffffffe8b0 = local_13a0;
      std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x36814a);
      in_stack_ffffffffffffe8c0 =
           LEARNER::
           init_multiclass_learner<warm_cb,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     ((free_ptr<warm_cb> *)in_stack_ffffffffffffe8c0,
                      (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                      in_stack_ffffffffffffe8b8,
                      (_func_void_warm_cb_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                       *)in_stack_ffffffffffffe8b0,predict,(parser *)in_stack_ffffffffffffe8a0,
                      CONCAT44(in_stack_ffffffffffffe89c,4),pred_type);
      local_1398 = in_stack_ffffffffffffe8c0;
    }
    else {
      ptVar11 = local_13a0;
      std::unique_ptr<warm_cb,_void_(*)(void_*)>::operator->
                ((unique_ptr<warm_cb,_void_(*)(void_*)> *)0x3680d0);
      local_1398 = LEARNER::
                   init_cost_sensitive_learner<warm_cb,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                             ((free_ptr<warm_cb> *)in_stack_ffffffffffffe8c0,
                              (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                              in_stack_ffffffffffffe8b8,
                              (_func_void_warm_cb_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                               *)in_stack_ffffffffffffe8b0,
                              (_func_void_warm_cb_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                               *)in_stack_ffffffffffffe8a8,(parser *)in_stack_ffffffffffffe8a0,
                              CONCAT44(in_stack_ffffffffffffe89c,4),(prediction_type_t)ptVar11);
    }
    LEARNER::learner<warm_cb,_example>::set_finish
              (in_stack_ffffffffffffe8c0,(_func_void_warm_cb_ptr *)in_stack_ffffffffffffe8b8);
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    in_stack_ffffffffffffe8a0 = (vw *)LEARNER::make_base<warm_cb,example>(local_1398);
    local_8 = in_stack_ffffffffffffe8a0;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_10e0 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe8a0);
  std::unique_ptr<warm_cb,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<warm_cb,_void_(*)(void_*)> *)in_stack_ffffffffffffe8b0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* warm_cb_setup(options_i& options, vw& all)
{
  uint32_t num_actions=0;
  auto data = scoped_calloc_or_throw<warm_cb>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Warm-starting Contextual Bandit");

  new_options
      .add(make_option("warm_cb", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("warm_cb_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"))
      .add(make_option("warm_start", data->ws_period).default_value(0U).help("number of training examples for warm start phase"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("interaction", data->inter_period).default_value(UINT32_MAX).help("number of examples for the interactive contextual bandit learning phase"))
      .add(make_option("warm_start_update", data->upd_ws).help("indicator of warm start updates"))
      .add(make_option("interaction_update", data->upd_inter).help("indicator of interaction updates"))
      .add(make_option("corrupt_type_warm_start", data->cor_type_ws).default_value(UAR).help("type of label corruption in the warm start phase (1: uniformly at random, 2: circular, 3: replacing with overwriting label)"))
      .add(make_option("corrupt_prob_warm_start", data->cor_prob_ws).default_value(0.f).help("probability of label corruption in the warm start phase"))
      .add(make_option("choices_lambda", data->choices_lambda).default_value(1U).help("the number of candidate lambdas to aggregate (lambda is the importance weight parameter between the two sources)"))
      .add(make_option("lambda_scheme", data->lambda_scheme).default_value(ABS_CENTRAL).help("The scheme for generating candidate lambda set (1: center lambda=0.5, 2: center lambda=0.5, min lambda=0, max lambda=1, 3: center lambda=epsilon/(1+epsilon), 4: center lambda=epsilon/(1+epsilon), min lambda=0, max lambda=1); the rest of candidate lambda values are generated using a doubling scheme"))
      .add(make_option("overwrite_label", data->overwrite_label).default_value(1U).help("the label used by type 3 corruptions (overwriting)"))
      .add(make_option("sim_bandit", data->sim_bandit).help("simulate contextual bandit updates on warm start examples"));

  options.add_and_parse(new_options);

  if( use_cs && ( options.was_supplied("corrupt_type_warm_start") || options.was_supplied("corrupt_prob_warm_start") ) )
  {
    THROW("label corruption on cost-sensitive examples not currently supported");
  }


  if(!options.was_supplied("warm_cb"))
  {
    return nullptr;
  }

  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;
	data->use_cs = use_cs;

  init_adf_data(*data.get(), num_actions);

  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<warm_cb,example>* l;

  multi_learner* base = as_multiline(setup_base(options, all));
	// Note: the current version of warm start CB can only support epsilon-greedy exploration
	// We need to wait for the epsilon value to be passed from the base
  // cb_explore learner, if there is one


  if (!options.was_supplied("epsilon"))
  {
    cerr<<"Warning: no epsilon (greedy parameter) specified; resetting to 0.05"<<endl;
    data->epsilon = 0.05f;
  }

  if (use_cs)
    l = &init_cost_sensitive_learner(data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, data->choices_lambda);
  else
    l = &init_multiclass_learner(data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, data->choices_lambda);

  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}